

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTransfer.cpp
# Opt level: O1

bool __thiscall CTransfer::BindListen(CTransfer *this)

{
  int iVar1;
  char *__s;
  int opt;
  undefined4 local_c;
  
  iVar1 = socket(2,1,0);
  this->sock = iVar1;
  if (iVar1 == -1) {
    __s = "control socket create error:";
  }
  else {
    this->pollfds[0].fd = iVar1;
    this->pollfds[0].events = 1;
    local_c = 1;
    setsockopt(iVar1,1,2,&local_c,4);
    iVar1 = bind(this->sock,(sockaddr *)&this->sockaddr,0x10);
    if (iVar1 == -1) {
      __s = "bind error:";
    }
    else {
      iVar1 = listen(this->sock,10);
      if (iVar1 != -1) {
        return true;
      }
      __s = "listen error:";
    }
  }
  perror(__s);
  return false;
}

Assistant:

bool CTransfer::BindListen() {
    sock = socket(AF_INET,SOCK_STREAM,0);
    if(sock == -1){
        perror("control socket create error:");
        return false;
    }
    pollfds[0].fd = sock;
    pollfds[0].events = POLLIN;

    int opt = 1;
    setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (const void *)&opt, sizeof(opt));

    if(bind(sock,(struct sockaddr*)&sockaddr,sizeof(sockaddr)) == -1){
        perror("bind error:");
        return false;
    }

    if(listen(sock,10) == -1){
        perror("listen error:");
        return false;
    }

    return true;
}